

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O1

STRING_HANDLE URL_Decode(STRING_HANDLE input)

{
  char cVar1;
  size_t i;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  byte *memory;
  STRING_HANDLE pSVar5;
  LOGGER_LOG p_Var6;
  int iVar7;
  byte *pbVar8;
  byte bVar9;
  size_t sVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  char cVar10;
  
  if (input == (STRING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar2 = "URL_Decode:: NULL input";
    iVar7 = 0x142;
    goto LAB_001319e2;
  }
  pcVar2 = STRING_c_str(input);
  sVar3 = strlen(pcVar2);
  if (pcVar2 == (char *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = 0;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                ,"calculateDecodedStringSize",0x70,1,"Null encoded string");
    }
  }
  else {
    if (sVar3 != 0) {
      lVar18 = 0;
      uVar17 = 0;
      sVar11 = sVar3;
LAB_001316a8:
      bVar12 = pcVar2[uVar17];
      uVar15 = (ulong)bVar12;
      lVar14 = 1;
      if (uVar15 < 0x2f) {
        if ((0x670200000001U >> (uVar15 & 0x3f) & 1) == 0) {
          if (uVar15 != 0x25) goto LAB_00131753;
          if (((2 < sVar11) &&
              ((bVar12 = pcVar2[uVar17 + 1], (byte)(bVar12 - 0x30) < 10 ||
               ((bVar12 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) != 0)))))) &&
             (((byte)(pcVar2[uVar17 + 2] - 0x30U) < 10 ||
              ((uVar13 = (byte)pcVar2[uVar17 + 2] - 0x41, uVar13 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar13 & 0x3f) & 1) != 0)))))) {
            lVar14 = 3;
            if ((bVar12 & 0xf8) == 0x30) goto LAB_001316c2;
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              pcVar16 = "Out of range of characters accepted by this decoder";
              iVar7 = 0x87;
              goto LAB_00131880;
            }
            goto LAB_0013188b;
          }
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0013188b;
          pcVar16 = "Incomplete or invalid percent encoding";
          iVar7 = 0x82;
          goto LAB_00131880;
        }
      }
      else {
LAB_00131753:
        if (((9 < (byte)(bVar12 - 0x30)) && (bVar12 != 0x5f)) &&
           (0x19 < (byte)((bVar12 & 0xdf) + 0xbf))) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0013188b;
          pcVar16 = "Unprintable value in encoded string";
          iVar7 = 0x92;
LAB_00131880:
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                    ,"calculateDecodedStringSize",iVar7,1,pcVar16);
          goto LAB_0013188b;
        }
      }
LAB_001316c2:
      lVar18 = lVar18 + 1;
      if (lVar18 == 0) {
        lVar18 = -1;
      }
      uVar17 = uVar17 + lVar14;
      sVar11 = sVar11 - lVar14;
      if (sVar3 <= uVar17) goto LAB_0013188b;
      goto LAB_001316a8;
    }
    sVar11 = 1;
  }
  goto LAB_001318a5;
LAB_0013188b:
  sVar4 = 0xffffffffffffffff;
  if (lVar18 + 1U != 0) {
    sVar4 = lVar18 + 1U;
  }
  sVar11 = 0;
  if (pcVar2[uVar17] == '\0') {
    sVar11 = sVar4;
  }
LAB_001318a5:
  if (sVar11 == 0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar2 = "URL_Decode:: Invalid input string";
      iVar7 = 0x14d;
LAB_001319e2:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                ,"URL_Decode",iVar7,1,pcVar2);
      return (STRING_HANDLE)0x0;
    }
  }
  else {
    memory = (byte *)malloc(sVar11);
    if (memory == (byte *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar2 = "URL_Decode:: MALLOC failure on decode.";
        iVar7 = 0x152;
        goto LAB_001319e2;
      }
    }
    else {
      uVar17 = 0;
      pbVar8 = memory;
      do {
        bVar12 = pcVar2[uVar17];
        lVar18 = 1;
        if (bVar12 == 0x25) {
          cVar1 = pcVar2[uVar17 + 1];
          bVar9 = cVar1 - 0x30;
          if (9 < bVar9) {
            cVar10 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar10 = cVar1;
            }
            bVar9 = cVar10 - 0x37;
          }
          cVar1 = pcVar2[uVar17 + 2];
          bVar12 = cVar1 - 0x30;
          if (9 < bVar12) {
            cVar10 = cVar1 + -0x20;
            if (0x19 < (byte)(cVar1 + 0x9fU)) {
              cVar10 = cVar1;
            }
            bVar12 = cVar10 - 0x37;
          }
          bVar12 = bVar9 << 4 | bVar12;
          lVar18 = 3;
        }
        *pbVar8 = bVar12;
        uVar17 = uVar17 + lVar18;
        pbVar8 = pbVar8 + 1;
      } while (uVar17 <= sVar3);
      pSVar5 = STRING_new_with_memory((char *)memory);
      if (pSVar5 != (STRING_HANDLE)0x0) {
        return pSVar5;
      }
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                  ,"URL_Decode",0x15b,1,"URL_Decode:: MALLOC failure on decode");
      }
      free(memory);
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE URL_Decode(STRING_HANDLE input)
{
    STRING_HANDLE result;
    if (input == NULL)
    {
        LogError("URL_Decode:: NULL input");
        result = NULL;
    }
    else
    {
        size_t decodedStringSize;
        char* decodedString;
        const char* inputString = STRING_c_str(input);
        size_t inputLen = strlen(inputString);
        if ((decodedStringSize = calculateDecodedStringSize(inputString, inputLen)) == 0)
        {
            LogError("URL_Decode:: Invalid input string");
            result = NULL;
        }
        else if ((decodedString = (char*)malloc(decodedStringSize)) == NULL)
        {
            LogError("URL_Decode:: MALLOC failure on decode.");
            result = NULL;
        }
        else
        {
            createDecodedString(inputString, inputLen, decodedString);
            result = STRING_new_with_memory(decodedString);
            if (result == NULL)
            {
                LogError("URL_Decode:: MALLOC failure on decode");
                free(decodedString);
            }
        }
    }
    return result;
}